

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O2

void ymz280b_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  ushort *__s_01;
  ushort uVar15;
  int iVar16;
  ulong uVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  ymz280b_state *chip;
  
  __s = *outputs;
  __s_00 = outputs[1];
  uVar25 = (ulong)samples;
  memset(__s,0,uVar25 * 4);
  memset(__s_00,0,uVar25 * 4);
  if (*(long *)((long)param + 0x2d0) != 0) {
    for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
      lVar13 = lVar24 * 0x4c;
      if (*(char *)((long)param + lVar13 + 0x69) == '\0') {
        pbVar1 = (byte *)((long)param + lVar13 + 0x20);
        uVar3 = *(ushort *)((long)param + lVar13 + 0x66);
        sVar4 = *(short *)(pbVar1 + 0x44);
        bVar2 = *pbVar1;
        if ((uVar3 == 0 && bVar2 == 0) && sVar4 == 0) {
          pbVar1[0x40] = 0;
          pbVar1[0x41] = 0x40;
          pbVar1[0x42] = 0;
          pbVar1[0x43] = 0;
          goto LAB_001493b9;
        }
        __s_01 = *(ushort **)((long)param + 0x2e0);
        iVar5 = *(int *)((long)param + lVar13 + 0x54);
        iVar6 = *(int *)((long)param + lVar13 + 0x58);
        iVar9 = *(int *)(pbVar1 + 0x40);
        for (uVar23 = 0; uVar25 != uVar23; uVar23 = uVar23 + 1) {
          if (0x3fff < iVar9) goto LAB_00148da9;
          iVar9 = iVar9 * (short)uVar3 + (0x4000 - iVar9) * (int)sVar4 >> 0xe;
          __s[uVar23] = __s[uVar23] + iVar9 * iVar5;
          __s_00[uVar23] = __s_00[uVar23] + iVar9 * iVar6;
          iVar9 = *(int *)(pbVar1 + 0x40) + *(int *)(pbVar1 + 0x3c);
          *(int *)(pbVar1 + 0x40) = iVar9;
        }
        uVar23 = uVar25;
        if (iVar9 < 0x4000) goto LAB_001493b9;
LAB_00148da9:
        *(int *)(pbVar1 + 0x40) = iVar9 + -0x4000;
        uVar19 = (samples - (int)uVar23) * *(int *)(pbVar1 + 0x3c) + iVar9 >> 0xe;
        uVar10 = 10000;
        if (uVar19 < 10000) {
          uVar10 = uVar19;
        }
        uVar11 = (uint)pbVar1[4] | (uint)bVar2 << 7;
        if (uVar11 == 0x83) {
          uVar11 = *(uint *)(pbVar1 + 0x1c);
          if (pbVar1[3] == 0) {
            uVar20 = 10000;
            if (uVar19 < 10000) {
              uVar20 = uVar19;
            }
            lVar13 = 0;
            do {
              if (uVar20 == (uint)lVar13) goto LAB_00149189;
              uVar12 = uVar11 >> 1 & 0xffffff;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar15 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12) << 8;
              }
              else {
                uVar15 = 0;
              }
              uVar12 = (uVar11 >> 1) + 1 & 0xffffff;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar18 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12);
              }
              else {
                uVar18 = 0;
              }
              __s_01[lVar13] = uVar18 | uVar15;
              uVar11 = uVar11 + 4;
              lVar13 = lVar13 + 1;
            } while (uVar11 < *(uint *)(pbVar1 + 0x10));
          }
          else {
            uVar20 = 10000;
            if (uVar19 < 10000) {
              uVar20 = uVar19;
            }
            lVar13 = 0;
            do {
              if (uVar20 == (uint)lVar13) goto LAB_00149189;
              uVar12 = uVar11 >> 1 & 0xffffff;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar15 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12) << 8;
              }
              else {
                uVar15 = 0;
              }
              uVar12 = (uVar11 >> 1) + 1 & 0xffffff;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar18 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12);
              }
              else {
                uVar18 = 0;
              }
              __s_01[lVar13] = uVar18 | uVar15;
              uVar11 = uVar11 + 4;
              if ((*(uint *)(pbVar1 + 0x18) <= uVar11) && (pbVar1[2] != 0)) {
                uVar11 = *(uint *)(pbVar1 + 0x14);
              }
              lVar13 = lVar13 + 1;
            } while (uVar11 < *(uint *)(pbVar1 + 0x10));
          }
LAB_00149174:
          if (9999 < uVar19) {
            uVar19 = 10000;
          }
          uVar19 = uVar19 - (int)lVar13;
          pbVar1[1] = 1;
          goto LAB_0014918c;
        }
        if (uVar11 == 0x82) {
          uVar11 = *(uint *)(pbVar1 + 0x1c);
          if (pbVar1[3] == 0) {
            uVar20 = 10000;
            if (uVar19 < 10000) {
              uVar20 = uVar19;
            }
            lVar13 = 0;
            do {
              if (uVar20 == (uint)lVar13) goto LAB_00149189;
              uVar12 = uVar11 >> 1 & 0xffffff;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar15 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12) << 8;
              }
              else {
                uVar15 = 0;
              }
              __s_01[lVar13] = uVar15;
              uVar11 = uVar11 + 2;
              lVar13 = lVar13 + 1;
            } while (uVar11 < *(uint *)(pbVar1 + 0x10));
          }
          else {
            uVar20 = 10000;
            if (uVar19 < 10000) {
              uVar20 = uVar19;
            }
            lVar13 = 0;
            do {
              if (uVar20 == (uint)lVar13) goto LAB_00149189;
              uVar12 = uVar11 >> 1 & 0xffffff;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar15 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12) << 8;
              }
              else {
                uVar15 = 0;
              }
              __s_01[lVar13] = uVar15;
              uVar11 = uVar11 + 2;
              if ((*(uint *)(pbVar1 + 0x18) <= uVar11) && (pbVar1[2] != 0)) {
                uVar11 = *(uint *)(pbVar1 + 0x14);
              }
              lVar13 = lVar13 + 1;
            } while (uVar11 < *(uint *)(pbVar1 + 0x10));
          }
          goto LAB_00149174;
        }
        if (uVar11 == 0x81) {
          uVar11 = *(uint *)(pbVar1 + 0x1c);
          uVar8 = (ulong)uVar11;
          iVar9 = *(int *)(pbVar1 + 0x20);
          iVar16 = *(int *)(pbVar1 + 0x24);
          if (pbVar1[3] == 0) {
            uVar20 = 10000;
            if (uVar19 < 10000) {
              uVar20 = uVar19;
            }
            iVar22 = uVar11 << 2;
            lVar13 = 0;
            do {
              if (uVar20 == (uint)lVar13) {
                uVar11 = (uint)lVar13 + uVar11;
                uVar19 = 0;
                goto LAB_001492b6;
              }
              uVar12 = (uint)(uVar8 + lVar13 >> 1) & 0xffffff;
              uVar21 = 0;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar21 = (uint)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12);
              }
              uVar21 = uVar21 >> (~(byte)iVar22 & 4);
              iVar9 = (diff_lookup[uVar21 & 0xf] * iVar16) / 8 + (iVar9 * 0xfe) / 0x100;
              if (iVar9 < -0x7fff) {
                iVar9 = -0x8000;
              }
              if (0x7ffe < iVar9) {
                iVar9 = 0x7fff;
              }
              iVar16 = iVar16 * index_scale[uVar21 & 7] >> 8;
              if (iVar16 < 0x80) {
                iVar16 = 0x7f;
              }
              if (0x5fff < iVar16) {
                iVar16 = 0x6000;
              }
              __s_01[lVar13] = (ushort)iVar9;
              lVar13 = lVar13 + 1;
              iVar7 = (int)lVar13;
              iVar22 = iVar22 + 4;
            } while (iVar7 + uVar11 < *(uint *)(pbVar1 + 0x10));
            if (9999 < uVar19) {
              uVar19 = 10000;
            }
            uVar19 = uVar19 - iVar7;
            uVar11 = iVar7 + uVar11;
          }
          else {
            uVar20 = 10000;
            if (uVar19 < 10000) {
              uVar20 = uVar19;
            }
            lVar13 = 0;
            do {
              uVar11 = (uint)uVar8;
              if (uVar20 == (uint)lVar13) {
                uVar19 = 0;
                goto LAB_001492b6;
              }
              uVar12 = (uint)(uVar8 >> 1) & 0xffffff;
              uVar21 = 0;
              if (uVar12 < *(uint *)((long)param + 0x2d8)) {
                uVar21 = (uint)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar12);
              }
              uVar21 = uVar21 >> (~((char)uVar8 * '\x04') & 4U);
              iVar9 = (diff_lookup[uVar21 & 0xf] * iVar16) / 8 + (iVar9 * 0xfe) / 0x100;
              if (iVar9 < -0x7fff) {
                iVar9 = -0x8000;
              }
              if (0x7ffe < iVar9) {
                iVar9 = 0x7fff;
              }
              iVar16 = iVar16 * index_scale[uVar21 & 7] >> 8;
              if (iVar16 < 0x80) {
                iVar16 = 0x7f;
              }
              if (0x5fff < iVar16) {
                iVar16 = 0x6000;
              }
              __s_01[lVar13] = (ushort)iVar9;
              uVar11 = uVar11 + 1;
              uVar8 = (ulong)uVar11;
              if ((uVar11 == *(uint *)(pbVar1 + 0x14)) && (*(int *)(pbVar1 + 0x30) == 0)) {
                *(int *)(pbVar1 + 0x28) = iVar9;
                *(int *)(pbVar1 + 0x2c) = iVar16;
              }
              if ((*(uint *)(pbVar1 + 0x18) <= uVar11) && (pbVar1[2] != 0)) {
                iVar9 = *(int *)(pbVar1 + 0x28);
                iVar16 = *(int *)(pbVar1 + 0x2c);
                *(int *)(pbVar1 + 0x30) = *(int *)(pbVar1 + 0x30) + 1;
                uVar8 = (ulong)*(uint *)(pbVar1 + 0x14);
              }
              lVar13 = lVar13 + 1;
              uVar11 = (uint)uVar8;
            } while (uVar11 < *(uint *)(pbVar1 + 0x10));
            if (9999 < uVar19) {
              uVar19 = 10000;
            }
            uVar19 = uVar19 - (int)lVar13;
          }
          pbVar1[1] = 1;
LAB_001492b6:
          *(uint *)(pbVar1 + 0x1c) = uVar11;
          *(int *)(pbVar1 + 0x20) = iVar9;
          *(int *)(pbVar1 + 0x24) = iVar16;
          goto LAB_001492c5;
        }
        memset(__s_01,0,(ulong)(uVar10 * 2));
        goto LAB_001492ca;
      }
LAB_001493b9:
    }
    for (uVar23 = 0; uVar25 != uVar23; uVar23 = uVar23 + 1) {
      (*outputs)[uVar23] = (*outputs)[uVar23] >> 8;
      outputs[1][uVar23] = outputs[1][uVar23] >> 8;
    }
    pcVar14 = (char *)((long)param + 0x68);
    for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
      if (*pcVar14 != '\0') {
        pcVar14[-0x48] = '\0';
        *(byte *)((long)param + 0x281) =
             *(byte *)((long)param + 0x281) | (byte)(1 << ((byte)lVar24 & 0x1f));
        update_irq_state((ymz280b_state *)param);
        *pcVar14 = '\0';
      }
      pcVar14 = pcVar14 + 0x4c;
    }
  }
  return;
LAB_00149189:
  uVar19 = 0;
LAB_0014918c:
  *(uint *)(pbVar1 + 0x1c) = uVar11;
LAB_001492c5:
  if (uVar19 == 0) {
LAB_001492ca:
    uVar19 = 0;
    if (pbVar1[1] == 0) goto LAB_00149330;
  }
  pbVar1[1] = 0;
  uVar11 = uVar10 - uVar19;
  uVar15 = uVar3;
  if (uVar11 != 0) {
    uVar15 = *(ushort *)(*(long *)((long)param + 0x2e0) + (ulong)(uVar11 - 1) * 2);
  }
  uVar8 = (ulong)uVar15;
  uVar17 = (ulong)uVar19;
  while (bVar26 = uVar17 != 0, uVar17 = uVar17 - 1, bVar26) {
    uVar8 = (long)((short)uVar8 * 0xf) / 0x10 & 0xffffffff;
    *(short *)(*(long *)((long)param + 0x2e0) + (ulong)uVar11 * 2) = (short)uVar8;
    uVar11 = uVar11 + 1;
  }
  if (uVar10 != uVar19) {
    *pbVar1 = 0;
    pbVar1[0x48] = 1;
  }
LAB_00149330:
  do {
    uVar15 = *__s_01;
    __s_01 = __s_01 + 1;
    do {
      if (samples <= (uint)uVar23) {
        *(ushort *)(pbVar1 + 0x44) = uVar3;
        *(ushort *)(pbVar1 + 0x46) = uVar15;
        goto LAB_001493b9;
      }
      for (uVar23 = uVar23 & 0xffffffff; uVar23 < uVar25; uVar23 = uVar23 + 1) {
        iVar9 = *(int *)(pbVar1 + 0x40);
        if (0x3fff < iVar9) goto LAB_00149396;
        iVar9 = iVar9 * (short)uVar15 + (0x4000 - iVar9) * (int)(short)uVar3 >> 0xe;
        __s[uVar23] = __s[uVar23] + iVar9 * iVar5;
        __s_00[uVar23] = __s_00[uVar23] + iVar9 * iVar6;
        *(int *)(pbVar1 + 0x40) = *(int *)(pbVar1 + 0x40) + *(int *)(pbVar1 + 0x3c);
      }
      iVar9 = *(int *)(pbVar1 + 0x40);
    } while (iVar9 < 0x4000);
LAB_00149396:
    *(int *)(pbVar1 + 0x40) = iVar9 + -0x4000;
    uVar3 = uVar15;
  } while( true );
}

Assistant:

static void ymz280b_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ymz280b_state *chip = (ymz280b_state *)param;
	DEV_SMPL *lacc = outputs[0];
	DEV_SMPL *racc = outputs[1];
	UINT8 v;
	UINT32 i;

	/* clear out the accumulator */
	memset(lacc, 0, samples * sizeof(lacc[0]));
	memset(racc, 0, samples * sizeof(racc[0]));
	if (chip->mem_base == NULL)
		return;

	/* loop over voices */
	for (v = 0; v < 8; v++)
	{
		struct YMZ280BVoice *voice = &chip->voice[v];
		INT16 prev = voice->last_sample;
		INT16 curr = voice->curr_sample;
		INT16 *curr_data = chip->scratch;
		INT32 *ldest = lacc;
		INT32 *rdest = racc;
		UINT32 new_samples, samples_left;
		UINT32 final_pos;
		INT32 lvol = voice->output_left;
		INT32 rvol = voice->output_right;
		
		/* skip if muted */
		if (voice->Muted)
			continue;

		/* quick out if we're not playing and we're at 0 */
		if (!voice->playing && curr == 0 && prev == 0)
		{
			/* make sure next sound plays immediately */
			voice->output_pos = FRAC_ONE;

			continue;
		}

		/* finish off the current sample */
		/* interpolate */
		for (i = 0; i < samples && voice->output_pos < FRAC_ONE; i++)
		{
			int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
			ldest[i] += interp_sample * lvol;
			rdest[i] += interp_sample * rvol;
			voice->output_pos += voice->output_step;
		}

		/* if we're over, continue; otherwise, we're done */
		if (voice->output_pos >= FRAC_ONE)
			voice->output_pos -= FRAC_ONE;
		else
			continue;

		/* compute how many new samples we need */
		final_pos = voice->output_pos + (samples - i) * voice->output_step;
		new_samples = (final_pos + FRAC_ONE) >> FRAC_BITS;
		if (new_samples > MAX_SAMPLE_CHUNK)
			new_samples = MAX_SAMPLE_CHUNK;

		/* generate them into our buffer */
		switch (voice->playing << 7 | voice->mode)
		{
			case 0x81:  samples_left = generate_adpcm(chip, voice, chip->scratch, new_samples); break;
			case 0x82:  samples_left = generate_pcm8(chip, voice, chip->scratch, new_samples); break;
			case 0x83:  samples_left = generate_pcm16(chip, voice, chip->scratch, new_samples); break;
			default:    samples_left = 0; memset(chip->scratch, 0, new_samples * sizeof(chip->scratch[0])); break;
		}

		if (samples_left || voice->ended)
		{
			UINT32 base;
			UINT32 j;
			INT16 t;
			
			voice->ended = 0;
			base = new_samples - samples_left;
			t = (base == 0) ? curr : chip->scratch[base - 1];
			
			for (j = 0; j < samples_left; j++)
			{
				t = (t * 15) / 16;
				chip->scratch[base + j] = t;
			}

			/* if we hit the end and IRQs are enabled, signal it */
			if (base != 0)
			{
				voice->playing = 0;

				/* set update_irq_state_timer. IRQ is signaled on next CPU execution. */
				voice->irq_schedule = 1;
			}
		}

		/* advance forward one sample */
		prev = curr;
		curr = *curr_data++;

		/* then sample-rate convert with linear interpolation */
		while (i < samples)
		{
			/* interpolate */
			for (; i < samples && voice->output_pos < FRAC_ONE; i++)
			{
				int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
				ldest[i] += interp_sample * lvol;
				rdest[i] += interp_sample * rvol;
				voice->output_pos += voice->output_step;
			}

			/* if we're over, grab the next samples */
			if (voice->output_pos >= FRAC_ONE)
			{
				voice->output_pos -= FRAC_ONE;
				prev = curr;
				curr = *curr_data++;
			}
		}

		/* remember the last samples */
		voice->last_sample = prev;
		voice->curr_sample = curr;
	}

	for (i = 0; i < samples; i++)
	{
		outputs[0][i] >>= 8;
		outputs[1][i] >>= 8;
	}
	
	for (v = 0; v < 8; v++)
		update_irq_state_timer_common(chip, v);
}